

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

void jsgf_grammar_free(jsgf_t *jsgf)

{
  glist_t pgVar1;
  hash_iter_t *phVar2;
  glist_t *ppgVar3;
  
  if (jsgf->parent == (jsgf_t *)0x0) {
    for (phVar2 = hash_table_iter(jsgf->rules); phVar2 != (hash_iter_t *)0x0;
        phVar2 = hash_table_iter_next(phVar2)) {
      ckd_free(phVar2->ent->key);
      jsgf_rule_free((jsgf_rule_t *)phVar2->ent->val);
    }
    hash_table_free(jsgf->rules);
    for (phVar2 = hash_table_iter(jsgf->imports); phVar2 != (hash_iter_t *)0x0;
        phVar2 = hash_table_iter_next(phVar2)) {
      ckd_free(phVar2->ent->key);
      jsgf_grammar_free((jsgf_t *)phVar2->ent->val);
    }
    hash_table_free(jsgf->imports);
    ppgVar3 = &jsgf->searchpath;
    while (pgVar1 = *ppgVar3, pgVar1 != (glist_t)0x0) {
      ckd_free((pgVar1->data).ptr);
      ppgVar3 = &pgVar1->next;
    }
    glist_free(jsgf->searchpath);
    ppgVar3 = &jsgf->links;
    while (pgVar1 = *ppgVar3, pgVar1 != (glist_t)0x0) {
      ckd_free((pgVar1->data).ptr);
      ppgVar3 = &pgVar1->next;
    }
    glist_free(jsgf->links);
  }
  ckd_free(jsgf->name);
  ckd_free(jsgf->version);
  ckd_free(jsgf->charset);
  ckd_free(jsgf->locale);
  ckd_free(jsgf);
  return;
}

Assistant:

void
jsgf_grammar_free(jsgf_t * jsgf)
{
    /* FIXME: Probably should just use refcounting instead. */
    if (jsgf->parent == NULL) {
        hash_iter_t *itor;
        gnode_t *gn;

        for (itor = hash_table_iter(jsgf->rules); itor;
             itor = hash_table_iter_next(itor)) {
            ckd_free((char *) itor->ent->key);
            jsgf_rule_free((jsgf_rule_t *) itor->ent->val);
        }
        hash_table_free(jsgf->rules);
        for (itor = hash_table_iter(jsgf->imports); itor;
             itor = hash_table_iter_next(itor)) {
            ckd_free((char *) itor->ent->key);
            jsgf_grammar_free((jsgf_t *) itor->ent->val);
        }
        hash_table_free(jsgf->imports);
        for (gn = jsgf->searchpath; gn; gn = gnode_next(gn))
            ckd_free(gnode_ptr(gn));
        glist_free(jsgf->searchpath);
        for (gn = jsgf->links; gn; gn = gnode_next(gn))
            ckd_free(gnode_ptr(gn));
        glist_free(jsgf->links);
    }
    ckd_free(jsgf->name);
    ckd_free(jsgf->version);
    ckd_free(jsgf->charset);
    ckd_free(jsgf->locale);
    ckd_free(jsgf);
}